

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printCoprocOptionImm(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  ulong uVar3;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint tmp;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar3 = MCOperand_getImm(op);
  if ((uint)uVar3 < 10) {
    SStream_concat(in_RDX,"{%u}",uVar3 & 0xffffffff);
  }
  else {
    SStream_concat(in_RDX,"{0x%x}",uVar3 & 0xffffffff);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = (uint)uVar3;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printCoprocOptionImm(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned tmp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "{0x%x}", tmp);
	else
		SStream_concat(O, "{%u}", tmp);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = tmp;
		MI->flat_insn->detail->arm.op_count++;
	}
}